

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.cpp
# Opt level: O2

void set_mul(FM_OPL *OPL,int slot,int v)

{
  byte bVar1;
  uint uVar2;
  OPL_CH *CH;
  
  bVar1 = (byte)v;
  CH = OPL->P_CH + slot / 2;
  uVar2 = slot & 1;
  CH->SLOT[uVar2].mul = "\x01\x02\x04\x06\b\n\f\x0e\x10\x12\x14\x14\x18\x18\x1e\x1e"[v & 0xf];
  CH->SLOT[uVar2].KSR = (byte)~bVar1 >> 3 & 2;
  CH->SLOT[uVar2].eg_type = bVar1 & 0x20;
  CH->SLOT[uVar2].vib = bVar1 & 0x40;
  CH->SLOT[uVar2].AMmask = (int)(char)bVar1 >> 7;
  CALC_FCSLOT(CH,CH->SLOT + uVar2);
  return;
}

Assistant:

void set_mul(FM_OPL *OPL,int slot,int v)
{
	OPL_CH   *CH   = &OPL->P_CH[slot/2];
	OPL_SLOT *SLOT = &CH->SLOT[slot&1];

	SLOT->mul     = mul_tab[v&0x0f];
	SLOT->KSR     = (v&0x10) ? 0 : 2;
	SLOT->eg_type = (v&0x20);
	SLOT->vib     = (v&0x40);
	SLOT->AMmask  = (v&0x80) ? ~0 : 0;
	CALC_FCSLOT(CH,SLOT);
}